

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deAppendList.hpp
# Opt level: O1

void __thiscall
de::AppendList<vk::AllocationCallbackRecord>::AppendList
          (AppendList<vk::AllocationCallbackRecord> *this,size_t blockSize)

{
  Block *pBVar1;
  AllocationCallbackRecord *pAVar2;
  
  this->m_blockSize = blockSize;
  this->m_numElements = 0;
  pBVar1 = (Block *)operator_new(0x18);
  pBVar1->blockNdx = 0;
  pAVar2 = (AllocationCallbackRecord *)deAlignedMalloc(blockSize * 0x30,8);
  pBVar1->elements = pAVar2;
  pBVar1->next = (Block *)0x0;
  this->m_first = pBVar1;
  this->m_last = pBVar1;
  return;
}

Assistant:

AppendList<ElementType>::AppendList (size_t blockSize)
	: m_blockSize	(blockSize)
	, m_numElements	(0)
	, m_first		(new Block(0, blockSize))
	, m_last		(m_first)
{
}